

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket-server.c
# Opt level: O0

int main(void)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  undefined1 local_428 [8];
  char buf [1024];
  sockaddr_in name;
  int length;
  int sock;
  
  name.sin_zero._4_4_ = socket(2,2,0);
  if ((int)name.sin_zero._4_4_ < 0) {
    perror("opening datagram socket");
    exit(1);
  }
  buf[0x3fc] = '\x02';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  iVar2 = bind(name.sin_zero._4_4_,(sockaddr *)(buf + 0x3fc),0x10);
  if (iVar2 != 0) {
    perror("binding datagram socket");
    exit(1);
  }
  name.sin_zero[0] = '\x10';
  name.sin_zero[1] = '\0';
  name.sin_zero[2] = '\0';
  name.sin_zero[3] = '\0';
  iVar2 = getsockname(name.sin_zero._4_4_,(sockaddr *)(buf + 0x3fc),(socklen_t *)name.sin_zero);
  if (iVar2 != 0) {
    perror("getting socket name");
    exit(1);
  }
  uVar1 = ntohs(buf._1022_2_);
  printf("Socket has port #%d\n",(ulong)uVar1);
  sVar3 = read(name.sin_zero._4_4_,local_428,0x400);
  if (sVar3 < 0) {
    perror("receiving datagram packet");
  }
  printf("-->%s\n",local_428);
  close(name.sin_zero._4_4_);
  return 0;
}

Assistant:

int main()
{
    int sock, length;
    struct sockaddr_in name;
    char buf[1024];

    /* Create socket from which to read. */
    sock = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock < 0) {
        perror("opening datagram socket");
        exit(1);
    }
    /* Create name with wildcards. */
    name.sin_family = AF_INET;
    name.sin_addr.s_addr = INADDR_ANY;
    name.sin_port = 0;
    if (bind(sock, (struct sockaddr *)&name, sizeof(name))) {
        perror("binding datagram socket");
        exit(1);
    }
    /* Find assigned port value and print it out. */
    length = sizeof(name);
    if (getsockname(sock, (struct sockaddr *)&name, &length)) {
        perror("getting socket name");
        exit(1);
    }
    printf("Socket has port #%d\n", ntohs(name.sin_port));
    /* Read from the socket */
    if (read(sock, buf, sizeof(buf)) < 0)
        perror("receiving datagram packet");
    printf("-->%s\n", buf);
    close(sock);
    return 0;
}